

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtractFunction.cpp
# Opt level: O0

void __thiscall wasm::ExtractFunctionIndex::run(ExtractFunctionIndex *this,Module *module)

{
  Module *module_00;
  bool bVar1;
  int iVar2;
  reference pcVar3;
  ulong uVar4;
  size_type sVar5;
  Fatal *pFVar6;
  reference this_00;
  pointer pFVar7;
  PassRunner *this_01;
  char *in_R8;
  Name name_00;
  Name name;
  Fatal local_3d0;
  uint local_244;
  undefined1 local_240 [4];
  Index i;
  char local_b1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_b0;
  char c;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  string local_90;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  string index;
  Module *module_local;
  ExtractFunctionIndex *this_local;
  
  index.field_2._8_8_ = module;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"extract-function-index",&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,
             "ExtractFunctionIndex usage: wasm-opt --extract-function-index=FUNCTION_INDEX",
             (allocator<char> *)((long)&__range2 + 7));
  Pass::getArgument((string *)local_38,&this->super_Pass,&local_58,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  __end2._M_current = (char *)std::__cxx11::string::begin();
  _Stack_b0._M_current = (char *)std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff50);
    if (!bVar1) break;
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end2);
    local_b1 = *pcVar3;
    iVar2 = isdigit((int)local_b1);
    if (iVar2 == 0) {
      Fatal::Fatal((Fatal *)local_240);
      Fatal::operator<<((Fatal *)local_240,(char (*) [32])"Expected numeric function index");
      Fatal::~Fatal((Fatal *)local_240);
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  local_244 = std::__cxx11::stoi((string *)local_38,(size_t *)0x0,10);
  uVar4 = (ulong)local_244;
  sVar5 = std::
          vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
          ::size((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  *)(index.field_2._8_8_ + 0x18));
  if (sVar5 <= uVar4) {
    Fatal::Fatal(&local_3d0);
    pFVar6 = Fatal::operator<<(&local_3d0,(char (*) [30])"Out of bounds function index ");
    pFVar6 = Fatal::operator<<(pFVar6,&local_244);
    pFVar6 = Fatal::operator<<(pFVar6,(char (*) [20])"! (module has only ");
    name.super_IString.str._M_str =
         (char *)std::
                 vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ::size((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                         *)(index.field_2._8_8_ + 0x18));
    pFVar6 = Fatal::operator<<(pFVar6,(unsigned_long *)&name.super_IString.str._M_str);
    Fatal::operator<<(pFVar6,(char (*) [12])" functions)");
    Fatal::~Fatal(&local_3d0);
  }
  this_00 = std::
            vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ::operator[]((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                          *)(index.field_2._8_8_ + 0x18),(ulong)local_244);
  pFVar7 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     (this_00);
  module_00 = (Module *)(pFVar7->super_Importable).super_Named.name.super_IString.str._M_len;
  name.super_IString.str._M_len =
       (size_t)(pFVar7->super_Importable).super_Named.name.super_IString.str._M_str;
  this_01 = Pass::getPassRunner(&this->super_Pass);
  name_00.super_IString.str._M_str = in_R8;
  name_00.super_IString.str._M_len = name.super_IString.str._M_len;
  wasm::extract((wasm *)this_01,(PassRunner *)index.field_2._8_8_,module_00,name_00);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void run(Module* module) override {
    std::string index = getArgument("extract-function-index",
                                    "ExtractFunctionIndex usage: wasm-opt "
                                    "--extract-function-index=FUNCTION_INDEX");
    for (char c : index) {
      if (!std::isdigit(c)) {
        Fatal() << "Expected numeric function index";
      }
    }
    Index i = std::stoi(index);
    if (i >= module->functions.size()) {
      Fatal() << "Out of bounds function index " << i << "! (module has only "
              << module->functions.size() << " functions)";
    }
    // Assumes imports are at the beginning
    Name name = module->functions[i]->name;
    extract(getPassRunner(), module, name);
  }